

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMessenger.cxx
# Opt level: O0

MessageType __thiscall cmMessenger::ConvertMessageType(cmMessenger *this,MessageType t)

{
  bool bVar1;
  MessageType t_local;
  cmMessenger *this_local;
  
  if ((t == AUTHOR_WARNING) || (t == AUTHOR_ERROR)) {
    bVar1 = GetDevWarningsAsErrors(this);
    if (bVar1) {
      this_local._4_4_ = AUTHOR_ERROR;
    }
    else {
      this_local._4_4_ = AUTHOR_WARNING;
    }
  }
  else if ((t == DEPRECATION_WARNING) || (this_local._4_4_ = t, t == DEPRECATION_ERROR)) {
    bVar1 = GetDeprecatedWarningsAsErrors(this);
    if (bVar1) {
      this_local._4_4_ = DEPRECATION_ERROR;
    }
    else {
      this_local._4_4_ = DEPRECATION_WARNING;
    }
  }
  return this_local._4_4_;
}

Assistant:

MessageType cmMessenger::ConvertMessageType(MessageType t) const
{
  if (t == MessageType::AUTHOR_WARNING || t == MessageType::AUTHOR_ERROR) {
    if (this->GetDevWarningsAsErrors()) {
      return MessageType::AUTHOR_ERROR;
    }
    return MessageType::AUTHOR_WARNING;
  }
  if (t == MessageType::DEPRECATION_WARNING ||
      t == MessageType::DEPRECATION_ERROR) {
    if (this->GetDeprecatedWarningsAsErrors()) {
      return MessageType::DEPRECATION_ERROR;
    }
    return MessageType::DEPRECATION_WARNING;
  }
  return t;
}